

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

void __thiscall ev3dev::remote_control::~remote_control(remote_control *this)

{
  infrared_sensor *piVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  
  this->_vptr_remote_control = (_func_int **)&PTR__remote_control_0011bcd0;
  if (this->_owns_sensor == true) {
    piVar1 = this->_sensor;
    if (piVar1 != (infrared_sensor *)0x0) {
      pcVar2 = (piVar1->super_sensor)._bin_data.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pcVar2 != (pointer)0x0) {
        operator_delete(pcVar2);
      }
      pcVar3 = (piVar1->super_sensor).super_device._path._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(piVar1->super_sensor).super_device._path.field_2) {
        operator_delete(pcVar3);
      }
    }
    operator_delete(piVar1);
  }
  p_Var4 = (this->on_state_change).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_state_change,(_Any_data *)&this->on_state_change,
              __destroy_functor);
  }
  p_Var4 = (this->on_beacon).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_beacon,(_Any_data *)&this->on_beacon,__destroy_functor);
  }
  p_Var4 = (this->on_blue_down).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_blue_down,(_Any_data *)&this->on_blue_down,__destroy_functor);
  }
  p_Var4 = (this->on_blue_up).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_blue_up,(_Any_data *)&this->on_blue_up,__destroy_functor);
  }
  p_Var4 = (this->on_red_down).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_red_down,(_Any_data *)&this->on_red_down,__destroy_functor);
  }
  p_Var4 = (this->on_red_up).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->on_red_up,(_Any_data *)&this->on_red_up,__destroy_functor);
  }
  return;
}

Assistant:

remote_control::~remote_control() {
    if (_owns_sensor)
        delete _sensor;
}